

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O1

err_t MATROSKA_BlockProcessFrameDurations(matroska_block *Block,stream *Input,int ForProfile)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  ebml_context *peVar9;
  ebml_integer *Element;
  int64_t iVar10;
  ebml_string *Element_00;
  bool_t bVar11;
  long lVar12;
  undefined8 uVar13;
  ebml_master *peVar14;
  ebml_element *peVar15;
  ebml_binary *Element_01;
  uint uVar16;
  ulong uVar17;
  err_t eVar18;
  int iVar19;
  char *pcVar20;
  uint uVar21;
  ulong uVar22;
  err_t eVar23;
  ebml_master *Track;
  ogg_packet OggPacket;
  ogg_reference OggRef;
  ogg_buffer OggBuffer;
  vorbis_comment vc;
  vorbis_info vi;
  tchar_t CodecID [256];
  int local_238;
  ebml_master *local_230;
  err_t local_228;
  byte *local_220;
  long local_218;
  long local_210;
  ogg_packet local_208;
  ogg_reference local_1d8;
  ogg_buffer local_1b0;
  vorbis_comment local_190;
  vorbis_info local_170;
  tchar_t local_138 [264];
  
  local_230 = (ebml_master *)0x0;
  if (Block == (matroska_block *)0x0) {
    __assert_fail("(const void*)(Block)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                  ,0x3b,
                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                 );
  }
  lVar8 = (**(code **)((long)(Block->Base).Base.Base.Base.VMT + 0x18))(Block,0x180,&local_230);
  peVar14 = local_230;
  if (lVar8 != 0) {
    return lVar8;
  }
  if (local_230 == (ebml_master *)0x0) {
    __assert_fail("Track!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                  ,0x3e,
                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                 );
  }
  peVar9 = MATROSKA_getContextTrackType();
  Element = (ebml_integer *)EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
  if (Element == (ebml_integer *)0x0) {
    return -3;
  }
  iVar10 = EBML_IntegerValue(Element);
  peVar14 = local_230;
  if (iVar10 != 2) {
    return -3;
  }
  if (Block->FirstFrameLocation == 0) {
    return -0x15;
  }
  peVar9 = MATROSKA_getContextCodecID();
  Element_00 = (ebml_string *)EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
  if (Element_00 == (ebml_string *)0x0) {
    return -3;
  }
  EBML_StringGet(Element_00,local_138,0x100);
  sVar2 = (Block->Data)._Used;
  if ((sVar2 == 0) && (eVar18 = MATROSKA_BlockReadData(Block,Input,ForProfile), eVar18 != 0)) {
    return eVar18;
  }
  bVar11 = tcsisame_ascii(local_138,"A_MPEG/L3");
  if (((bVar11 == 0) && (bVar11 = tcsisame_ascii(local_138,"A_MPEG/L2"), bVar11 == 0)) &&
     (bVar11 = tcsisame_ascii(local_138,"A_MPEG/L1"), bVar11 == 0)) {
    bVar11 = tcsisame_ascii(local_138,"A_AC3");
    if (bVar11 == 0) {
      bVar11 = tcsisame_ascii(local_138,"A_EAC3");
      if (bVar11 == 0) {
        bVar11 = tcsisame_ascii(local_138,"A_DTS");
        if (bVar11 == 0) {
          bVar11 = tcsisame_ascii(local_138,"A_AAC");
          if ((bVar11 == 0) && (iVar19 = tcsncmp(local_138,"A_AAC/",6), iVar19 != 0)) {
            bVar11 = tcsisame_ascii(local_138,"A_VORBIS");
            peVar14 = local_230;
            if (bVar11 == 0) {
              eVar18 = 0;
            }
            else {
              Block->IsKeyframe = 1;
              peVar9 = MATROSKA_getContextCodecPrivate();
              eVar18 = 0;
              Element_01 = (ebml_binary *)EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
              if (Element_01 != (ebml_binary *)0x0) {
                vorbis_info_init(&local_170);
                vorbis_comment_init(&local_190);
                local_208.granulepos = 0;
                local_208.packetno = 0;
                local_208.b_o_s = 0;
                local_208.e_o_s = 0;
                local_208.packet = (ogg_reference *)0x0;
                local_208.bytes = 0;
                local_1b0.data = EBML_BinaryGetData(Element_01);
                local_1b0.size = EBML_ElementDataSize((ebml_element *)Element_01,1);
                local_1b0.refcount = 1;
                local_208.packet = &local_1d8;
                local_1d8.begin = 0;
                local_1d8.length = 0;
                local_1d8.next = (ogg_reference *)0x0;
                local_208.packetno = -1;
                bVar1 = *local_1b0.data;
                local_238 = bVar1 + 1;
                lVar8 = 1;
                local_1d8.buffer = &local_1b0;
LAB_001102a8:
                if ((local_208.packetno < 3) && ((int)lVar8 <= (int)(uint)bVar1)) {
                  local_1d8.begin = (long)local_238;
                  local_1d8.length = 0;
                  lVar12 = (long)(int)lVar8;
                  do {
                    local_1d8.length = (ulong)local_1b0.data[lVar12] + local_1d8.length;
                    lVar8 = lVar12 + 1;
                    if (local_1b0.data[lVar12] != 0xff) break;
                    bVar5 = lVar12 < (long)(ulong)bVar1;
                    lVar12 = lVar8;
                  } while (bVar5);
                  local_238 = local_238 + (int)local_1d8.length;
                  if (local_238 <= local_1b0.size) goto code_r0x0011031b;
                  goto LAB_001103d2;
                }
                if (local_208.packetno < 3) {
                  local_1d8.begin = (long)local_238;
                  local_1d8.length = local_1b0.size - local_1d8.begin;
                  local_208.packetno = local_208.packetno + 1;
                  local_208.b_o_s = (long)(local_208.packetno == 0);
                  local_208.bytes = (local_208.packet)->length;
                  iVar19 = vorbis_synthesis_headerin(&local_170,&local_190,&local_208);
                  if ((iVar19 < 0) && (local_208.packetno == 0)) goto LAB_001103d2;
                }
                eVar18 = 0;
                ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                if (3 < (Block->SizeList)._Used) {
                  local_220 = (byte *)(Block->Data)._Begin;
                  local_210 = local_170.rate << 0x20;
                  local_218 = (long)(int)local_170.rate;
                  uVar22 = 0;
                  local_228 = 0;
                  do {
                    eVar18 = local_228;
                    iVar19 = _ilog(*(int *)((long)local_170.codec_setup + 0x10) - 1);
                    uVar16 = (*local_220 & 0x7f) >> (7U - (char)iVar19 & 0x1f);
                    iVar19 = *(int *)((long)local_170.codec_setup + 0x10);
                    if (iVar19 < (int)uVar16) {
                      eVar18 = -3;
                    }
                    lVar8 = 0;
                    if (iVar19 < (int)uVar16) {
                      lVar8 = 0x7fffffffffffffff;
                    }
                    if (local_210 != 0 && (int)uVar16 <= iVar19) {
                      lVar8 = ((long)*(int *)((long)local_170.codec_setup +
                                             (long)**(int **)((long)local_170.codec_setup +
                                                             (ulong)uVar16 * 8 + 0x28) * 8) *
                              1000000000) / local_218;
                      eVar18 = local_228;
                    }
                    *(long *)((Block->Durations)._Begin + uVar22 * 8) = lVar8;
                    local_220 = local_220 + *(int *)((Block->SizeList)._Begin + uVar22 * 4);
                    uVar22 = uVar22 + 1;
                    local_228 = eVar18;
                  } while (uVar22 < (Block->SizeList)._Used >> 2);
                }
                vorbis_comment_clear(&local_190);
                vorbis_info_clear(&local_170);
                bVar5 = true;
                goto LAB_00110513;
              }
            }
          }
          else {
            peVar14 = local_230;
            Block->IsKeyframe = 1;
            peVar9 = MATROSKA_getContextAudio();
            eVar18 = 0;
            peVar14 = (ebml_master *)EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
            if (peVar14 != (ebml_master *)0x0) {
              peVar9 = MATROSKA_getContextSamplingFrequency();
              eVar18 = 0;
              peVar15 = EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
              if (peVar15 != (ebml_element *)0x0) {
                eVar18 = 0;
                ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                if (3 < (Block->SizeList)._Used) {
                  iVar19 = (int)*(double *)&peVar15[1].Base.Base;
                  pcVar3 = (Block->Durations)._Begin;
                  eVar18 = 0;
                  uVar22 = 0;
                  do {
                    if (iVar19 == 0) {
                      uVar13 = 0;
                    }
                    else {
                      uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xee6b280000)) /
                                      SEXT816((long)iVar19),0);
                    }
                    *(undefined8 *)(pcVar3 + uVar22 * 8) = uVar13;
                    uVar22 = uVar22 + 1;
                  } while (uVar22 < (Block->SizeList)._Used >> 2);
                }
              }
            }
          }
        }
        else {
          Block->IsKeyframe = 1;
          eVar18 = 0;
          ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
          if (3 < (Block->SizeList)._Used) {
            pcVar3 = (Block->SizeList)._Begin;
            pcVar20 = (Block->Data)._Begin;
            pcVar4 = (Block->Durations)._Begin;
            uVar22 = 0;
            eVar23 = 0;
            do {
              uVar16 = (byte)pcVar20[8] >> 2 & 0xf;
              uVar13 = 0x7fffffffffffffff;
              eVar18 = -3;
              if ((0xc631U >> uVar16 & 1) == 0) {
                eVar18 = eVar23;
                if ((0xc631U >> uVar16 & 1) == 0) {
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = (ulong)(byte)(pcVar20[4] << 7 | (byte)pcVar20[5] >> 2) *
                                 32000000000 + 32000000000;
                  uVar13 = SUB168(auVar6 / SEXT816((long)A_DTS_freq[uVar16]),0);
                }
                else {
                  uVar13 = 0;
                }
              }
              *(undefined8 *)(pcVar4 + uVar22 * 8) = uVar13;
              pcVar20 = pcVar20 + *(int *)(pcVar3 + uVar22 * 4);
              uVar22 = uVar22 + 1;
              eVar23 = eVar18;
            } while (uVar22 < (Block->SizeList)._Used >> 2);
          }
        }
      }
      else {
        Block->IsKeyframe = 1;
        eVar18 = 0;
        ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
        if (3 < (Block->SizeList)._Used) {
          pcVar3 = (Block->SizeList)._Begin;
          pcVar20 = (Block->Data)._Begin;
          pcVar4 = (Block->Durations)._Begin;
          uVar22 = 0;
          eVar23 = 0;
          do {
            uVar21 = (uint)((byte)pcVar20[4] >> 6);
            uVar16 = (byte)pcVar20[4] >> 4 & 3;
            lVar8 = 0x7fffffffffffffff;
            eVar18 = -3;
            if (uVar16 != 3 || uVar21 != 3) {
              lVar8 = 0x165a0bc0000;
              uVar7 = uVar16 + 3;
              if (uVar21 != 3) {
                uVar7 = uVar21;
              }
              if (uVar21 != 3) {
                lVar8 = (long)A_EAC3_samples[uVar16] * 1000000000;
              }
              lVar8 = lVar8 / (long)A_EAC3_freq[uVar7];
              eVar18 = eVar23;
            }
            *(long *)(pcVar4 + uVar22 * 8) = lVar8;
            pcVar20 = pcVar20 + *(int *)(pcVar3 + uVar22 * 4);
            uVar22 = uVar22 + 1;
            eVar23 = eVar18;
          } while (uVar22 < (Block->SizeList)._Used >> 2);
        }
      }
    }
    else {
      Block->IsKeyframe = 1;
      eVar18 = 0;
      ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
      if (3 < (Block->SizeList)._Used) {
        pcVar3 = (Block->SizeList)._Begin;
        pcVar20 = (Block->Data)._Begin;
        pcVar4 = (Block->Durations)._Begin;
        uVar22 = 0;
        eVar23 = 0;
        do {
          uVar13 = 0x7fffffffffffffff;
          eVar18 = -3;
          if (0xe7 < (byte)(pcVar20[5] + 0xa8U)) {
            lVar8 = (long)*(int *)((long)A_AC3_freq[0] +
                                  (ulong)((byte)pcVar20[4] >> 6) * 4 +
                                  (ulong)((byte)pcVar20[5] & 0x18) * 2);
            eVar18 = eVar23;
            if (lVar8 == 0) {
              uVar13 = 0;
            }
            else {
              uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x165a0bc0000)) / SEXT816(lVar8),0);
            }
          }
          *(undefined8 *)(pcVar4 + uVar22 * 8) = uVar13;
          pcVar20 = pcVar20 + *(int *)(pcVar3 + uVar22 * 4);
          uVar22 = uVar22 + 1;
          eVar23 = eVar18;
        } while (uVar22 < (Block->SizeList)._Used >> 2);
      }
    }
  }
  else {
    Block->IsKeyframe = 1;
    eVar18 = 0;
    ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
    if (3 < (Block->SizeList)._Used) {
      pcVar3 = (Block->SizeList)._Begin;
      pcVar20 = (Block->Data)._Begin;
      pcVar4 = (Block->Durations)._Begin;
      uVar22 = 0;
      eVar23 = 0;
      do {
        uVar17 = (ulong)((byte)pcVar20[1] >> 1 & 0xc);
        lVar8 = (long)*(int *)((long)A_MPEG_freq[0] + uVar17 + (ulong)((byte)pcVar20[2] & 0xc) * 4);
        eVar18 = -3;
        if (lVar8 == 0) {
          lVar12 = 0x7fffffffffffffff;
        }
        else {
          iVar19 = *(int *)((long)A_MPEG_samples[0] + uVar17 + (ulong)((byte)pcVar20[1] & 6) * 8);
          lVar12 = 0x7fffffffffffffff;
          if (iVar19 != 0) {
            lVar12 = ((long)iVar19 * 1000000000) / lVar8;
            eVar18 = eVar23;
          }
        }
        *(long *)(pcVar4 + uVar22 * 8) = lVar12;
        pcVar20 = pcVar20 + *(int *)(pcVar3 + uVar22 * 4);
        uVar22 = uVar22 + 1;
        eVar23 = eVar18;
      } while (uVar22 < (Block->SizeList)._Used >> 2);
    }
  }
LAB_0010fd72:
  if (sVar2 == 0) {
    ArrayClear(&Block->Data);
    (Block->Base).Base.bValueIsSet = '\0';
  }
  return eVar18;
code_r0x0011031b:
  local_208.packetno = local_208.packetno + 1;
  local_208.b_o_s = (long)(local_208.packetno == 0);
  local_208.bytes = (local_208.packet)->length;
  iVar19 = vorbis_synthesis_headerin(&local_170,&local_190,&local_208);
  if ((-1 < iVar19) || (local_208.packetno != 0)) goto LAB_001102a8;
LAB_001103d2:
  eVar18 = 0;
  bVar5 = false;
LAB_00110513:
  if (!bVar5) {
    return -3;
  }
  goto LAB_0010fd72;
}

Assistant:

err_t MATROSKA_BlockProcessFrameDurations(matroska_block *Block, struct stream *Input, int ForProfile)
{
    ebml_master *Track=NULL;
    ebml_element *Elt;
    tchar_t CodecID[MAXPATH];
    err_t Err;
    bool_t ReadData;
    uint8_t *Cursor;
    size_t Frame;
    int Version, Layer, SampleRate, Samples, fscod, fscod2;

    Err = Node_GET(Block,MATROSKA_BLOCK_READ_TRACK,&Track);
    if (Err==ERR_NONE)
    {
        assert(Track!=NULL);
        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextTrackType());
        if (!Elt || EBML_IntegerValue((ebml_integer*)Elt)!=MATROSKA_TRACK_TYPE_AUDIO) // other track types not supported for now
            Err = ERR_INVALID_DATA;
        else
        {
            if (Block->FirstFrameLocation==0)
                Err = ERR_READ;
            else
            {
                Elt = EBML_MasterFindChild(Track,MATROSKA_getContextCodecID());
                if (!Elt) // missing codec ID
                    Err = ERR_INVALID_DATA;
                else
                {
                    EBML_StringGet((ebml_string*)Elt,CodecID,TSIZEOF(CodecID));
                    ReadData = 0;
                    if (!ARRAYCOUNT(Block->Data,uint8_t))
                    {
                        Err = MATROSKA_BlockReadData(Block,Input,ForProfile);
                        if (Err!=ERR_NONE)
                            goto exit;
                        ReadData = 1;
                    }

                    if (tcsisame_ascii(CodecID,T("A_MPEG/L3")) || tcsisame_ascii(CodecID,T("A_MPEG/L2")) || tcsisame_ascii(CodecID,T("A_MPEG/L1")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            Version = (Cursor[1] >> 3) & 3;
                            Layer = (Cursor[1] >> 1) & 3;
                            SampleRate = (Cursor[2] >> 2) & 3;

                            Samples = A_MPEG_samples[Layer][Version];
                            SampleRate = A_MPEG_freq[SampleRate][Version];
                            if (SampleRate!=0 && Samples!=0)
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            else
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }

                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_AC3")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            fscod =  Cursor[5] >> 3;
                            SampleRate = Cursor[4] >> 6;
                            if (fscod > 10 || fscod < 8)
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                            {
                                SampleRate = A_AC3_freq[fscod-8][SampleRate];
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,1536,SampleRate);
                            }
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_EAC3")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            fscod =  Cursor[4] >> 6;
                            fscod2 = (Cursor[4] >> 4) & 0x03;
                            if ((0x03 == fscod) && (0x03 == fscod2))
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                            {
                                SampleRate = A_EAC3_freq[0x03 == fscod ? 3 + fscod2 : fscod];
                                Samples = (0x03 == fscod) ? 1536 : A_EAC3_samples[fscod2];
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            }
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_DTS")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            Samples = (((Cursor[4] & 1) << 7) + (Cursor[5] >> 2) + 1) * 32;
                            // TODO: handle the frame termination
                            SampleRate = A_DTS_freq[(Cursor[8] >> 2) & 0x0F];
                            if (Samples==0 || SampleRate==0)
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_AAC")) || tcsncmp(CodecID,T("A_AAC/"),6)==0)
                    {
                        Block->IsKeyframe = 1; // safety
                        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextAudio());
                        if (Elt)
                        {
                            Elt = EBML_MasterFindChild((ebml_master*)Elt,MATROSKA_getContextSamplingFrequency());
                            if (Elt)
                            {
                                ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                                Samples = 1024;
                                SampleRate = (int)((ebml_float*)Elt)->Value;
                                for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            }
                        }
                    }
#if defined(CONFIG_CODEC_HELPER)
                    else if (tcsisame_ascii(CodecID,T("A_VORBIS")))
                    {
                        Block->IsKeyframe = 1; // safety
                        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextCodecPrivate());
                        if (Elt)
                        {
                            vorbis_info vi;
                            vorbis_comment vc;
                            ogg_packet OggPacket;
                        	ogg_reference OggRef;
                        	ogg_buffer OggBuffer;
                            int n,i,j;
                            codec_setup_info *ci;

		                    vorbis_info_init(&vi);
		                    vorbis_comment_init(&vc);
                            memset(&OggPacket,0,sizeof(ogg_packet));

		                    OggBuffer.data = (uint8_t*)EBML_BinaryGetData((ebml_binary*)Elt);
		                    OggBuffer.size = (long)EBML_ElementDataSize(Elt, 1);
		                    OggBuffer.refcount = 1;

                            memset(&OggRef,0,sizeof(OggRef));
		                    OggRef.buffer = &OggBuffer;
		                    OggRef.next = NULL;

		                    OggPacket.packet = &OggRef;
		                    OggPacket.packetno = -1;

		                    n = OggBuffer.data[0];
		                    i = 1+n;
		                    j = 1;

		                    while (OggPacket.packetno < 3 && n>=j)
		                    {
			                    OggRef.begin = i;
			                    OggRef.length = 0;
			                    do
			                    {
				                    OggRef.length += OggBuffer.data[j];
			                    }
			                    while (OggBuffer.data[j++] == 255 && n>=j);
			                    i += OggRef.length;

			                    if (i > OggBuffer.size)
				                    return ERR_INVALID_DATA;

	                            ++OggPacket.packetno;
	                            OggPacket.b_o_s = OggPacket.packetno == 0;
	                            OggPacket.bytes = OggPacket.packet->length;
			                    if (!(vorbis_synthesis_headerin(&vi,&vc,&OggPacket) >= 0) && OggPacket.packetno==0)
				                    return ERR_INVALID_DATA;
		                    }

		                    if (OggPacket.packetno < 3)
		                    {
			                    OggRef.begin = i;
			                    OggRef.length = OggBuffer.size - i;

	                            ++OggPacket.packetno;
	                            OggPacket.b_o_s = OggPacket.packetno == 0;
	                            OggPacket.bytes = OggPacket.packet->length;

                                if (!(vorbis_synthesis_headerin(&vi,&vc,&OggPacket) >= 0) && OggPacket.packetno==0)
				                    return ERR_INVALID_DATA;
                            }

                            SampleRate = vi.rate;
                            ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                            Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                            ci = vi.codec_setup;
                            for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                            {
                                fscod = _ilog(ci->modes-1);
                                fscod = (Cursor[0] & 0x7F) >> (7-fscod);
                                if (fscod > ci->modes)
                                {
                                    Err = ERR_INVALID_DATA;
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                    //goto exit;
                                }
                                else
                                {
                                    Samples = ci->blocksizes[ci->mode_param[fscod]->blockflag];
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                                }
                                Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                            }
                            vorbis_comment_clear(&vc);
                            vorbis_info_clear(&vi);
                        }
                    }
#endif

                    if (ReadData)
                    {
                        ArrayClear(&Block->Data);
                        Block->Base.Base.bValueIsSet = 0;
                    }
                }
            }
        }
    }
exit:
    return Err;
}